

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O3

Status __thiscall leveldb::DBImpl::NewDB(DBImpl *this)

{
  WritableFile *pWVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined1 auVar3 [8];
  long in_RSI;
  WritableFile *file;
  Writer log;
  string manifest;
  string record;
  VersionEdit new_db;
  WritableFile *local_150;
  undefined1 local_148 [8];
  WritableFile *local_140;
  DB local_138;
  size_type sStack_130;
  Writer local_128;
  string local_108;
  string local_e8;
  VersionEdit local_c8;
  
  VersionEdit::VersionEdit(&local_c8);
  local_108._M_dataplus._M_p = (pointer)(**(code **)(**(long **)(in_RSI + 0x18) + 0x18))();
  local_108._M_string_length = strlen(local_108._M_dataplus._M_p);
  VersionEdit::SetComparatorName(&local_c8,(Slice *)&local_108);
  local_c8.has_log_number_ = true;
  local_c8.log_number_ = 0;
  local_c8.has_next_file_number_ = true;
  local_c8.has_last_sequence_ = true;
  local_c8.next_file_number_ = 2;
  local_c8.last_sequence_ = 0;
  DescriptorFileName(&local_108,(string *)(in_RSI + 0x98),1);
  (**(code **)(**(long **)(in_RSI + 8) + 0x20))(this,*(long **)(in_RSI + 8),&local_108,&local_150);
  if ((this->super_DB)._vptr_DB == (_func_int **)0x0) {
    leveldb::log::Writer::Writer(&local_128,local_150);
    local_e8._M_string_length = 0;
    local_e8.field_2._M_local_buf[0] = '\0';
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    VersionEdit::EncodeTo(&local_c8,&local_e8);
    local_138._vptr_DB = (_func_int **)local_e8._M_dataplus._M_p;
    sStack_130 = local_e8._M_string_length;
    leveldb::log::Writer::AddRecord((Writer *)local_148,(Slice *)&local_128);
    pWVar1 = (WritableFile *)(this->super_DB)._vptr_DB;
    (this->super_DB)._vptr_DB = (_func_int **)local_148;
    auVar3 = local_148;
    local_148 = (undefined1  [8])pWVar1;
    if (pWVar1 != (WritableFile *)0x0) {
      operator_delete__(pWVar1);
      auVar3 = (undefined1  [8])(this->super_DB)._vptr_DB;
    }
    if (auVar3 == (undefined1  [8])0x0) {
      (*local_150->_vptr_WritableFile[3])(&local_138);
      paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(this->super_DB)._vptr_DB;
      (this->super_DB)._vptr_DB = local_138._vptr_DB;
      local_138._vptr_DB = (_func_int **)paVar2;
      if (paVar2 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
        operator_delete__(paVar2);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    leveldb::log::Writer::~Writer(&local_128);
    if (local_150 != (WritableFile *)0x0) {
      (*local_150->_vptr_WritableFile[1])();
    }
    if ((this->super_DB)._vptr_DB == (_func_int **)0x0) {
      SetCurrentFile((leveldb *)&local_128,*(Env **)(in_RSI + 8),(string *)(in_RSI + 0x98),1);
      local_140 = (WritableFile *)(this->super_DB)._vptr_DB;
      (this->super_DB)._vptr_DB = (_func_int **)local_128.dest_;
      local_128.dest_ = local_140;
    }
    else {
      (**(code **)(**(long **)(in_RSI + 8) + 0x40))(&local_140,*(long **)(in_RSI + 8),&local_108);
    }
    if (local_140 != (WritableFile *)0x0) {
      operator_delete__(local_140);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  VersionEdit::~VersionEdit(&local_c8);
  return (Status)(char *)this;
}

Assistant:

Status DBImpl::NewDB() {
  VersionEdit new_db;
  new_db.SetComparatorName(user_comparator()->Name());
  new_db.SetLogNumber(0);
  new_db.SetNextFile(2);
  new_db.SetLastSequence(0);

  const std::string manifest = DescriptorFileName(dbname_, 1);
  WritableFile* file;
  Status s = env_->NewWritableFile(manifest, &file);
  if (!s.ok()) {
    return s;
  }
  {
    log::Writer log(file);
    std::string record;
    new_db.EncodeTo(&record);
    s = log.AddRecord(record);
    if (s.ok()) {
      s = file->Close();
    }
  }
  delete file;
  if (s.ok()) {
    // Make "CURRENT" file that points to the new manifest file.
    s = SetCurrentFile(env_, dbname_, 1);
  } else {
    env_->DeleteFile(manifest);
  }
  return s;
}